

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpsm_cli_main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  __middle;
  undefined **ppuVar1;
  pointer pcVar2;
  MatchInfo *pMVar3;
  long lVar4;
  string_ref query_00;
  pointer pTVar5;
  undefined8 uVar6;
  undefined8 __last;
  char cVar7;
  bool bVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  char *pcVar10;
  typed_value<unsigned_long,_char> *ptVar11;
  const_iterator cVar12;
  long *plVar13;
  istream *piVar14;
  any *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  unsigned_long *puVar17;
  ulong uVar18;
  Thread *pTVar19;
  ulong uVar20;
  Error *pEVar21;
  code *info;
  MatcherOptions *opts_00;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_00;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_01;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_02;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_03;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_04;
  anon_class_48_6_59189e45_for__M_head_impl *__args;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *matches;
  long lVar22;
  pointer pbVar23;
  ulong uVar24;
  Thread *this;
  ulong uVar25;
  Thread *other;
  uint uVar26;
  StringRefItem item;
  StringRefItem item_00;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> threads;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  all_matches;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  thread_matches;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  variables_map opts;
  options_description opts_desc;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> local_3b8;
  undefined1 local_3a0 [88];
  pointer local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  MatchInfo *local_318;
  size_type local_310;
  MatchInfo local_308 [2];
  char *local_2f8;
  size_t sStack_2f0;
  char *local_2e8;
  size_t sStack_2e0;
  char local_2d8 [16];
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  Iterator local_2a8;
  thread local_2a0;
  pointer local_280;
  pointer local_230;
  pointer local_208;
  pointer local_1e0;
  MatcherOptions local_1c0;
  pointer local_1a8;
  pointer pbStack_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_178 [24];
  _Rb_tree_node_base local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b0 [24];
  void *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_70 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  ppuVar1 = (undefined **)(local_2c8 + 0x10);
  local_2c8._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_d8,(string *)local_2c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((undefined **)local_2c8._0_8_ != ppuVar1) {
    operator_delete((void *)local_2c8._0_8_);
  }
  local_3a0._0_8_ = boost::program_options::options_description::add_options();
  ptVar9 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2c8._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2c8);
  pcVar10 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_3a0,(value_semantic *)"crfile",(char *)ptVar9);
  ptVar11 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_338._M_dataplus._M_p = (pointer)0xa;
  ptVar11 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar11,(unsigned_long *)&local_338);
  pcVar10 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar10,(value_semantic *)"limit",(char *)ptVar11);
  ptVar9 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
  ptVar9 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_178);
  pcVar10 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar10,(value_semantic *)"query",(char *)ptVar9);
  boost::program_options::options_description_easy_init::operator()(pcVar10,"help");
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((undefined **)local_2c8._0_8_ != ppuVar1) {
    operator_delete((void *)local_2c8._0_8_);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_178);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_2c8,argc,argv,(options_description *)local_d8,0,
             &local_58);
  boost::program_options::store((basic_parsed_options *)local_2c8,(variables_map *)local_178,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_2c8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_178);
  local_2c8._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"help","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(local_178 + 0x10),(key_type *)local_2c8);
  if ((undefined **)local_2c8._0_8_ != ppuVar1) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (cVar12._M_node == &local_160) {
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    while( true ) {
      local_338._M_string_length = 0;
      *local_338._M_dataplus._M_p = '\0';
      cVar7 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
      piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)&local_338,cVar7);
      if (((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
                 &local_338);
    }
    local_2c8._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"crfile","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    local_318 = local_308;
    pcVar2 = (pbVar16->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,pcVar2,pcVar2 + pbVar16->_M_string_length);
    if ((undefined **)local_2c8._0_8_ != ppuVar1) {
      operator_delete((void *)local_2c8._0_8_);
    }
    local_2c8._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"limit","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    puVar17 = boost::any_cast<unsigned_long_const&>(paVar15);
    pMVar3 = (MatchInfo *)*puVar17;
    if ((undefined **)local_2c8._0_8_ != ppuVar1) {
      operator_delete((void *)local_2c8._0_8_);
    }
    local_2c8._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"query","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    local_2e8 = local_2d8;
    pcVar2 = (pbVar16->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,pcVar2,pcVar2 + pbVar16->_M_string_length);
    if ((undefined **)local_2c8._0_8_ != ppuVar1) {
      operator_delete((void *)local_2c8._0_8_);
    }
    local_3a0[0x27] = 0;
    local_3a0._35_4_ = 0;
    local_3a0._0_8_ = local_318;
    local_3a0._8_8_ = local_310;
    local_3a0._24_8_ = 0x100000000;
    local_3a0._32_2_ = 1;
    local_3a0[0x22] = '\x01';
    local_1a8 = local_198.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pbStack_1a0 = local_198.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_2f8 = local_2e8;
    sStack_2f0 = sStack_2e0;
    local_1c0.crfile.ptr_ = (char *)local_318;
    local_1c0.crfile.len_ = local_310;
    local_1c0.match_crfile = false;
    info = (code *)local_318;
    local_3a0._16_8_ = pMVar3;
    std::
    vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
    ::vector((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
              *)(local_3a0 + 0x50),1,(allocator_type *)local_2c8);
    local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_start = (Thread *)0x0;
    local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (Thread *)0x0;
    local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Thread *)0x0;
    std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::reserve
              (&local_3b8,(ulong)local_3a0._24_8_ >> 0x20);
    uVar20 = 0;
    __args = extraout_RDX;
    if (local_3a0._28_4_ != 0) {
      do {
        pTVar5 = local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        other = local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                super__Vector_impl_data._M_start;
        local_2c8._8_8_ = local_3a0;
        local_2b8._M_allocated_capacity = (size_type)&local_1a8;
        local_2a0._M_id._M_thread = (id)((long)local_3a0 + 0x50);
        local_2c8._0_4_ = (int)uVar20;
        local_2b8._8_8_ = &local_2f8;
        local_2a8._M_current = (char *)&local_1c0;
        if (local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar22 = (long)local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          uVar24 = lVar22 * -0x5555555555555555;
          uVar18 = uVar24 + (uVar24 == 0);
          uVar25 = uVar18 + uVar24;
          info = (code *)0x2aaaaaaaaaaaaaa;
          if (0x2aaaaaaaaaaaaa9 < uVar25) {
            uVar25 = 0x2aaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar18,uVar24)) {
            uVar25 = 0x2aaaaaaaaaaaaaa;
          }
          if (uVar25 == 0) {
            pTVar19 = (Thread *)0x0;
          }
          else {
            pTVar19 = __gnu_cxx::new_allocator<cpsm::Thread>::allocate
                                ((new_allocator<cpsm::Thread> *)&local_3b8,uVar25,(void *)0x0);
            __args = extraout_RDX_01;
          }
          std::allocator_traits<std::allocator<cpsm::Thread>>::
          construct<cpsm::Thread,cpsm::detail::for_each_match<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
                    ((allocator_type *)(&(pTVar19->exception_msg_)._M_dataplus + lVar22 * 2),
                     (Thread *)local_2c8,__args);
          __args = extraout_RDX_02;
          this = pTVar19;
          local_3a0._72_8_ = other;
          for (; other != pTVar5; other = other + 1) {
            cpsm::Thread::Thread(this,other);
            cpsm::Thread::~Thread(other);
            this = this + 1;
            __args = extraout_RDX_03;
          }
          if ((Thread *)local_3a0._72_8_ != (Thread *)0x0) {
            operator_delete((void *)local_3a0._72_8_);
            __args = extraout_RDX_04;
          }
          local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pTVar19 + uVar25;
          local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
          super__Vector_impl_data._M_start = pTVar19;
        }
        else {
          std::allocator_traits<std::allocator<cpsm::Thread>>::
          construct<cpsm::Thread,cpsm::detail::for_each_match<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
                    ((allocator_type *)
                     local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Thread *)local_2c8,__args);
          __args = extraout_RDX_00;
          this = local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        }
        local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
        super__Vector_impl_data._M_finish = this + 1;
        uVar26 = (int)uVar20 + 1;
        uVar20 = (ulong)uVar26;
      } while (uVar26 < (uint)local_3a0._28_4_);
      if (local_3a0._28_4_ == 0) {
        uVar20 = 0;
      }
      else {
        lVar22 = 0;
        uVar25 = 0;
        uVar20 = 0;
        do {
          pTVar5 = local_3b8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl
                   .super__Vector_impl_data._M_start;
          std::thread::join();
          if ((&pTVar5->has_exception_msg_)[lVar22 * 2] == true) {
            pEVar21 = (Error *)__cxa_allocate_exception(0x28);
            local_2c8._0_8_ = local_2c8 + 0x10;
            lVar4 = *(long *)((long)&(pTVar5->exception_msg_)._M_dataplus._M_p + lVar22 * 2);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2c8,lVar4,
                       *(long *)((long)&(pTVar5->exception_msg_)._M_string_length + lVar22 * 2) +
                       lVar4);
            cpsm::Error::Error<std::__cxx11::string>
                      (pEVar21,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2c8);
            __cxa_throw(pEVar21,&cpsm::Error::typeinfo,cpsm::Error::~Error);
          }
          info = (code *)((*(long *)((long)(local_3a0._80_8_ + 8) + lVar22) -
                           *(long *)((long)&(((_Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                                               *)local_3a0._80_8_)->_M_impl).super__Vector_impl_data
                                            ._M_start + lVar22) >> 3) * -0x5555555555555555);
          uVar20 = (long)&((MatchInfo *)info)->_vptr_MatchInfo + uVar20;
          uVar25 = uVar25 + 1;
          lVar22 = lVar22 + 0x18;
        } while (uVar25 < (ulong)local_3a0._24_8_ >> 0x20);
      }
    }
    local_3a0._40_8_ = (pointer)0x0;
    local_3a0._48_8_ = (pointer)0x0;
    local_3a0._56_8_ = (pointer)0x0;
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::reserve((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
               *)(local_3a0 + 0x28),uVar20);
    if ((pointer)local_3a0._80_8_ != local_348) {
      pbVar23 = (pointer)local_3a0._80_8_;
      do {
        std::__copy_move<true,false,std::random_access_iterator_tag>::
        __copy_m<cpsm::detail::Matched<cpsm::StringRefItem>*,std::back_insert_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>>
                  ((((_Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                      *)&pbVar23->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start,
                   (Matched<cpsm::StringRefItem> *)pbVar23->_M_string_length,
                   (vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                    *)(local_3a0 + 0x28));
        if ((pointer)(pbVar23->field_2)._M_allocated_capacity != (pointer)pbVar23->_M_string_length)
        {
          std::
          __shrink_to_fit_aux<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_true>
          ::_S_do_it((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                      *)pbVar23);
        }
        pbVar23 = (pointer)((pbVar23->field_2)._M_local_buf + 8);
      } while (pbVar23 != local_348);
    }
    __last = local_3a0._48_8_;
    uVar6 = local_3a0._40_8_;
    if (((MatchInfo *)local_3a0._16_8_ == (MatchInfo *)0x0) ||
       (info = (code *)(((long)(local_3a0._48_8_ - local_3a0._40_8_) >> 3) * -0x5555555555555555),
       info <= (ulong)local_3a0._16_8_)) {
      if (local_3a0._40_8_ != local_3a0._48_8_) {
        uVar20 = ((long)(local_3a0._48_8_ - local_3a0._40_8_) >> 3) * -0x5555555555555555;
        lVar22 = 0x3f;
        if (uVar20 != 0) {
          for (; uVar20 >> lVar22 == 0; lVar22 = lVar22 + -1) {
          }
        }
        info = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                  ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                    )local_3a0._40_8_,
                   (__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                    )local_3a0._48_8_,(ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                    )0x115a9a);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                  ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                    )uVar6,(__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                            )__last,
                   (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                    )0x115a9a);
      }
    }
    else {
      __middle._M_current =
           (Matched<cpsm::StringRefItem> *)(local_3a0._40_8_ + local_3a0._16_8_ * 0x18);
      info = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
      local_2c8._0_8_ = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
      std::
      __heap_select<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )local_3a0._40_8_,__middle,
                 (__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )local_3a0._48_8_,
                 (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                  )0x115a9a);
      std::
      __sort_heap<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )uVar6,__middle,
                 (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                  *)local_2c8);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::resize((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                *)(local_3a0 + 0x28),local_3a0._16_8_);
    }
    uVar6 = local_3a0._48_8_;
    pbVar23 = (pointer)local_3a0._40_8_;
    if (local_3a0[0x22] == '\x01') {
      query_00.len_ = sStack_2f0;
      query_00.ptr_ = local_2f8;
      opts_00 = &local_1c0;
      cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::Matcher
                ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)local_2c8,query_00,
                 opts_00);
      uVar6 = local_3a0._48_8_;
      if (local_3a0._40_8_ != local_3a0._48_8_) {
        pbVar23 = (pointer)local_3a0._40_8_;
        do {
          bVar8 = cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match
                            ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)
                             local_2c8,((StringRefItem *)&pbVar23->_M_string_length)->item_);
          if (!bVar8) {
            pEVar21 = (Error *)__cxa_allocate_exception(0x28);
            cpsm::Error::
            Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
                      (pEVar21,"failed to re-match known match \'",
                       ((StringRefItem *)&pbVar23->_M_string_length)->item_,
                       "\' during match position collection");
            __cxa_throw(pEVar21,&cpsm::Error::typeinfo,cpsm::Error::~Error);
          }
          item.item_.len_ = (size_t)local_2c8;
          item.item_.ptr_ = (char *)(pbVar23->field_2)._M_allocated_capacity;
          main::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     (((StringRefItem *)&pbVar23->_M_string_length)->item_).ptr_,item,
                     (MatchInfo *)opts_00);
          pbVar23 = (pointer)((pbVar23->field_2)._M_local_buf + 8);
        } while (pbVar23 != (pointer)uVar6);
      }
      local_2c8._0_8_ = &PTR__Matcher_00120d10;
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if (local_208 != (pointer)0x0) {
        operator_delete(local_208);
      }
      if (local_230 != (pointer)0x0) {
        operator_delete(local_230);
      }
      if (local_280 != (pointer)0x0) {
        operator_delete(local_280);
      }
      if (local_2a0._M_id._M_thread != 0) {
        operator_delete((void *)local_2a0._M_id._M_thread);
      }
      if ((pointer)local_2c8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c8._8_8_);
      }
    }
    else {
      for (; pbVar23 != (pointer)uVar6; pbVar23 = (pointer)((pbVar23->field_2)._M_local_buf + 8)) {
        item_00.item_.len_ = 0;
        item_00.item_.ptr_ = (char *)(pbVar23->field_2)._M_allocated_capacity;
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)
                   (((StringRefItem *)&pbVar23->_M_string_length)->item_).ptr_,item_00,
                   (MatchInfo *)info);
      }
    }
    if ((pointer)local_3a0._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_3a0._40_8_);
    }
    std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::~vector(&local_3b8);
    std::
    vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
    ::~vector((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
               *)(local_3a0 + 0x50));
    if (local_2e8 != local_2d8) {
      operator_delete(local_2e8);
    }
    if (local_318 != local_308) {
      operator_delete(local_318);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
  }
  else {
    plVar13 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_d8);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
  }
  local_178._0_8_ = std::ios::clear;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)(local_178 + 0x10));
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_70);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
    local_98 = (void *)0x0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b0);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::cin.sync_with_stdio(false);
  std::cout.sync_with_stdio(false);
  std::cerr.sync_with_stdio(false);

  po::options_description opts_desc("Options");
  opts_desc.add_options()
      ("crfile", po::value<std::string>()->default_value(""),
       "'currently open file' passed to the matcher")
      ("limit", po::value<std::size_t>()->default_value(10),
       "maximum number of matches to return")
      ("query", po::value<std::string>()->default_value(""),
       "query to match items against")
      ("help", "display this help and exit")
      ;

  po::variables_map opts;
  po::store(po::parse_command_line(argc, argv, opts_desc), opts);
  po::notify(opts);

  if (opts.count("help")) {
    std::cout << opts_desc << std::endl;
    return 0;
  }

  std::vector<std::string> lines;
  std::string line;
  while (std::getline(std::cin, line)) {
    lines.emplace_back(std::move(line));
    line.clear();
  }

  auto const crfile = opts["crfile"].as<std::string>();
  auto const limit = opts["limit"].as<std::size_t>();
  auto const query = opts["query"].as<std::string>();
  auto const mopts =
      cpsm::Options().set_crfile(crfile).set_limit(limit).set_want_match_info(
          true);
  cpsm::for_each_match<cpsm::StringRefItem>(
      query, mopts, cpsm::source_from_range<cpsm::StringRefItem>(lines.cbegin(),
                                                                 lines.cend()),
      [&](cpsm::StringRefItem item, cpsm::MatchInfo const* info) {
        std::cout << item.item() << "\n- score: " << info->score() << "; "
                  << info->score_debug_string() << "\n- match positions: "
                  << cpsm::str_join(info->match_positions(), ", ") << std::endl;
      });

  return 0;
}